

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

void bcf_hrec_debug(FILE *fp,bcf_hrec_t *hrec)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = "";
  if (hrec->value != (char *)0x0) {
    pcVar1 = hrec->value;
  }
  fprintf((FILE *)fp,"key=[%s] value=[%s]",hrec->key,pcVar1);
  if (0 < hrec->nkeys) {
    lVar2 = 0;
    do {
      fprintf((FILE *)fp,"\t[%s]=[%s]",hrec->keys[lVar2],hrec->vals[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < hrec->nkeys);
  }
  fputc(10,(FILE *)fp);
  return;
}

Assistant:

void bcf_hrec_debug(FILE *fp, bcf_hrec_t *hrec)
{
    fprintf(fp, "key=[%s] value=[%s]", hrec->key, hrec->value?hrec->value:"");
    int i;
    for (i=0; i<hrec->nkeys; i++)
        fprintf(fp, "\t[%s]=[%s]", hrec->keys[i],hrec->vals[i]);
    fprintf(fp, "\n");
}